

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::clear_supportVectors(SupportVectorClassifier *this)

{
  if (((this->_oneof_case_[0] == 4) || (this->_oneof_case_[0] == 3)) &&
     ((this->supportVectors_).sparsesupportvectors_ != (SparseSupportVectors *)0x0)) {
    (*(((this->supportVectors_).sparsesupportvectors_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void SupportVectorClassifier::clear_supportVectors() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.SupportVectorClassifier)
  switch (supportVectors_case()) {
    case kSparseSupportVectors: {
      delete supportVectors_.sparsesupportvectors_;
      break;
    }
    case kDenseSupportVectors: {
      delete supportVectors_.densesupportvectors_;
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = SUPPORTVECTORS_NOT_SET;
}